

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool_extension.cpp
# Opt level: O1

uint64 __thiscall
dlib::thread_pool_implementation::add_task_internal
          (thread_pool_implementation *this,bfp_type *bfp,
          shared_ptr<dlib::thread_pool_implementation::function_object_copy> *item)

{
  bfp_type *this_00;
  ulong uVar1;
  pthread_t *ppVar2;
  long lVar3;
  size_t sVar4;
  task_state_type *ptVar5;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  ulong uVar8;
  pthread_t pVar9;
  long lVar10;
  uint64 uVar11;
  ulong uVar12;
  bool bVar13;
  auto_mutex M;
  auto_mutex local_40;
  
  local_40.m = &this->m;
  local_40.r = (rmutex *)0x0;
  local_40.rw = (read_write_mutex *)0x0;
  pthread_mutex_lock((pthread_mutex_t *)local_40.m);
  pVar9 = pthread_self();
  lVar10 = find_empty_task_slot(this);
  if (lVar10 == -1) {
    uVar1 = (this->worker_thread_ids).array_size;
    bVar13 = uVar1 != 0;
    if (bVar13) {
      ppVar2 = (this->worker_thread_ids).array_elements;
      bVar13 = true;
      if (*ppVar2 != pVar9) {
        uVar8 = 1;
        do {
          uVar12 = uVar8;
          if (uVar1 == uVar12) break;
          uVar8 = uVar12 + 1;
        } while (ppVar2[uVar12] != pVar9);
        bVar13 = uVar12 < uVar1;
      }
    }
    if ((bVar13) || ((this->tasks).array_size == 0)) {
      auto_mutex::unlock(&local_40);
      uVar11 = 1;
      (**(code **)(*(bfp->bf_memory).data + 0x10))();
      goto LAB_001a6078;
    }
  }
  while (lVar10 == -1) {
    pthread_cond_wait((pthread_cond_t *)&(this->task_done_signaler).cond,
                      (pthread_mutex_t *)(this->task_done_signaler).associated_mutex);
    lVar10 = find_empty_task_slot(this);
  }
  this_00 = &(this->tasks).array_elements[lVar10].bfp;
  *(pthread_t *)((long)(this_00 + -2) + 0x40) = pVar9;
  lVar3 = *(long *)((long)(this_00 + -2) + 0x48);
  sVar4 = (this->tasks).array_size;
  *(long *)((long)(this_00 + -2) + 0x48) = lVar3 + 1;
  *(size_t *)((long)(this_00 + -2) + 0x38) = sVar4 * lVar3 + lVar10;
  bound_function_pointer::operator=(this_00,bfp);
  ptVar5 = (this->tasks).array_elements;
  peVar6 = ptVar5[lVar10].function_copy.
           super___shared_ptr<dlib::thread_pool_implementation::function_object_copy,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  ptVar5[lVar10].function_copy.
  super___shared_ptr<dlib::thread_pool_implementation::function_object_copy,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (item->
            super___shared_ptr<dlib::thread_pool_implementation::function_object_copy,_(__gnu_cxx::_Lock_policy)2>
            )._M_ptr;
  (item->
  super___shared_ptr<dlib::thread_pool_implementation::function_object_copy,_(__gnu_cxx::_Lock_policy)2>
  )._M_ptr = peVar6;
  p_Var7 = (item->
           super___shared_ptr<dlib::thread_pool_implementation::function_object_copy,_(__gnu_cxx::_Lock_policy)2>
           )._M_refcount._M_pi;
  (item->
  super___shared_ptr<dlib::thread_pool_implementation::function_object_copy,_(__gnu_cxx::_Lock_policy)2>
  )._M_refcount._M_pi =
       ptVar5[lVar10].function_copy.
       super___shared_ptr<dlib::thread_pool_implementation::function_object_copy,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  ptVar5[lVar10].function_copy.
  super___shared_ptr<dlib::thread_pool_implementation::function_object_copy,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var7;
  pthread_cond_signal((pthread_cond_t *)&(this->task_ready_signaler).cond);
  uVar11 = (this->tasks).array_elements[lVar10].task_id;
LAB_001a6078:
  auto_mutex::unlock(&local_40);
  return uVar11;
}

Assistant:

uint64 thread_pool_implementation::
    add_task_internal (
        const bfp_type& bfp,
        std::shared_ptr<function_object_copy>& item
    )
    {
        auto_mutex M(m);
        const thread_id_type my_thread_id = get_thread_id();

        // find a thread that isn't doing anything
        long idx = find_empty_task_slot();
        if (idx == -1 && is_worker_thread(my_thread_id))
        {
            // this function is being called from within a worker thread and there
            // aren't any other worker threads free so just perform the task right
            // here

            M.unlock();
            bfp();

            // return a task id that is both non-zero and also one
            // that is never normally returned.  This way calls
            // to wait_for_task() will never block given this id.
            return 1;
        }

        // wait until there is a thread that isn't doing anything
        while (idx == -1)
        {
            task_done_signaler.wait();
            idx = find_empty_task_slot();
        }

        tasks[idx].thread_id = my_thread_id;
        tasks[idx].task_id = make_next_task_id(idx);
        tasks[idx].bfp = bfp;
        tasks[idx].function_copy.swap(item);

        task_ready_signaler.signal();

        return tasks[idx].task_id;
    }